

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.h
# Opt level: O2

void __thiscall
Js::EntryPointInfo::EntryPointInfo
          (EntryPointInfo *this,JavascriptMethod method,JavascriptLibrary *library,
          ThreadContext *context,bool isLoopBody)

{
  ProxyEntryPointInfo::ProxyEntryPointInfo(&this->super_ProxyEntryPointInfo,method,context);
  (this->super_ProxyEntryPointInfo).super_ExpirableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_013772c8;
  this->field_0x18 = (isLoopBody * '\x02' | this->field_0x18 & 0xc0) + 1;
  this->state = NotScheduled;
  (this->nativeEntryPointData).ptr = (NativeEntryPointData *)0x0;
  (this->workItem).ptr = (CodeGenWorkItem *)0x0;
  Memory::WriteBarrierPtr<Js::JavascriptLibrary>::WriteBarrierSet(&this->library,library);
  this->cleanupStack = (Type)0x0;
  this->cleanupReason = NotCleanedUp;
  (this->fieldAccessStats).ptr = (FieldAccessStats *)0x0;
  (this->serializedRpcData).ptr = (uchar *)0x0;
  this->serializedRpcDataSize = 0;
  return;
}

Assistant:

EntryPointInfo(Js::JavascriptMethod method, JavascriptLibrary* library, ThreadContext* context = nullptr, bool isLoopBody = false) :
            ProxyEntryPointInfo(method, context), tag(1), nativeEntryPointProcessed(false), mIsTemplatizedJitMode(false),
#if ENABLE_NATIVE_CODEGEN
            nativeEntryPointData(nullptr), workItem(nullptr), state(NotScheduled),
            isLoopBody(isLoopBody), hasJittedStackClosure(false),
#endif
            library(library), isAsmJsFunction(false)
#if ENABLE_ENTRYPOINT_CLEANUP_TRACE
#if ENABLE_DEBUG_STACK_BACK_TRACE
            , cleanupStack(nullptr)
#endif
            , cleanupReason(NotCleanedUp)
#endif
#ifdef FIELD_ACCESS_STATS
            , fieldAccessStats(nullptr)
#endif
        {}